

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O3

SeatDialogPromptDescriptions * sshproxy_prompt_descriptions(Seat *seat)

{
  SeatDialogPromptDescriptions *pSVar1;
  
  if (seat[-0x411].vt != (SeatVtable *)0x0) {
    pSVar1 = (SeatDialogPromptDescriptions *)(**(code **)((seat[-0x411].vt)->output + 0x78))();
    return pSVar1;
  }
  pSVar1 = nullseat_prompt_descriptions((Seat *)0x0);
  return pSVar1;
}

Assistant:

static const SeatDialogPromptDescriptions *sshproxy_prompt_descriptions(
    Seat *seat)
{
    SshProxy *sp = container_of(seat, SshProxy, seat);

    /* If we have a client seat, return their prompt descriptions, so
     * that prompts passed on to them will make sense. */
    if (sp->clientseat)
        return seat_prompt_descriptions(sp->clientseat);

    /* Otherwise, it doesn't matter what we return, so do the easiest thing. */
    return nullseat_prompt_descriptions(NULL);
}